

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O1

size_t OPENSSL_strlcat(char *dst,char *src,size_t dst_size)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = dst_size;
  if (dst_size == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0;
    do {
      if (dst[sVar1] == '\0') {
        dst = dst + sVar1;
        goto LAB_0019a578;
      }
      sVar1 = sVar1 + 1;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
    sVar2 = 0;
    sVar1 = dst_size;
    dst = dst + dst_size;
  }
LAB_0019a578:
  sVar2 = OPENSSL_strlcpy(dst,src,sVar2);
  return sVar2 + sVar1;
}

Assistant:

size_t OPENSSL_strlcat(char *dst, const char *src, size_t dst_size) {
  size_t l = 0;
  for (; dst_size > 0 && *dst; dst_size--, dst++) {
    l++;
  }
  return l + OPENSSL_strlcpy(dst, src, dst_size);
}